

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_12_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_888;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_67c;
  float fStack_670;
  float fStack_664;
  float local_658;
  float fStack_63c;
  float fStack_630;
  float fStack_624;
  float local_618;
  float fStack_5fc;
  float fStack_5f0;
  float fStack_5e4;
  float local_5d8;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  
  decode = output_buffer;
  pfStack_888 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 7;
    local_5d8 = (float)*(undefined8 *)pfStack_888;
    local_2e8 = (float)*(undefined8 *)pfVar1;
    fStack_2e4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_2dc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    local_308 = (float)*(undefined8 *)(pfVar1 + 3);
    fStack_304 = (float)((ulong)*(undefined8 *)(pfVar1 + 3) >> 0x20);
    fStack_300 = (float)*(undefined8 *)(pfVar1 + 5);
    fStack_2fc = (float)((ulong)*(undefined8 *)(pfVar1 + 5) >> 0x20);
    fStack_5e4 = (float)((ulong)*(undefined8 *)pfStack_888 >> 0x20);
    local_328 = (float)*(undefined8 *)(pfVar1 + 7);
    fStack_324 = (float)((ulong)*(undefined8 *)(pfVar1 + 7) >> 0x20);
    fStack_320 = (float)*(undefined8 *)(pfVar1 + 9);
    fStack_31c = (float)((ulong)*(undefined8 *)(pfVar1 + 9) >> 0x20);
    local_348 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_344 = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_340 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_33c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_5f0 = (float)*(undefined8 *)(pfStack_888 + 2);
    local_368 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_364 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    fStack_360 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_35c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    local_388 = (float)*(undefined8 *)(pfVar1 + 0x11);
    fStack_384 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x11) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(pfVar1 + 0x13);
    fStack_37c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x13) >> 0x20);
    fStack_5fc = (float)((ulong)*(undefined8 *)(pfStack_888 + 2) >> 0x20);
    local_3a8 = (float)*(undefined8 *)(pfVar1 + 0x15);
    fStack_3a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x15) >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(pfVar1 + 0x17);
    fStack_39c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x17) >> 0x20);
    local_3c8 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_3c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_3bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    local_618 = (float)*(undefined8 *)(pfStack_888 + 4);
    local_3e8 = (float)*(undefined8 *)(pfVar1 + 0x1c);
    fStack_3e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1c) >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(pfVar1 + 0x1e);
    fStack_3dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1e) >> 0x20);
    local_408 = (float)*(undefined8 *)(pfVar1 + 0x1f);
    fStack_404 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1f) >> 0x20);
    fStack_400 = (float)*(undefined8 *)(pfVar1 + 0x21);
    fStack_3fc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x21) >> 0x20);
    fStack_624 = (float)((ulong)*(undefined8 *)(pfStack_888 + 4) >> 0x20);
    local_428 = (float)*(undefined8 *)(pfVar1 + 0x23);
    fStack_424 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x23) >> 0x20);
    fStack_420 = (float)*(undefined8 *)(pfVar1 + 0x25);
    fStack_41c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x25) >> 0x20);
    local_448 = (float)*(undefined8 *)(pfVar1 + 0x26);
    fStack_444 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x26) >> 0x20);
    fStack_440 = (float)*(undefined8 *)(pfVar1 + 0x28);
    fStack_43c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x28) >> 0x20);
    fStack_630 = (float)*(undefined8 *)(pfStack_888 + 6);
    local_468 = (float)*(undefined8 *)(pfVar1 + 0x2a);
    fStack_464 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2a) >> 0x20);
    fStack_460 = (float)*(undefined8 *)(pfVar1 + 0x2c);
    fStack_45c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2c) >> 0x20);
    local_488 = (float)*(undefined8 *)(pfVar1 + 0x2d);
    fStack_484 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2d) >> 0x20);
    fStack_480 = (float)*(undefined8 *)(pfVar1 + 0x2f);
    fStack_47c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2f) >> 0x20);
    fStack_63c = (float)((ulong)*(undefined8 *)(pfStack_888 + 6) >> 0x20);
    local_4a8 = (float)*(undefined8 *)(pfVar1 + 0x31);
    fStack_4a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x31) >> 0x20);
    fStack_4a0 = (float)*(undefined8 *)(pfVar1 + 0x33);
    fStack_49c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x33) >> 0x20);
    local_4c8 = (float)*(undefined8 *)(pfVar1 + 0x34);
    fStack_4c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x34) >> 0x20);
    fStack_4c0 = (float)*(undefined8 *)(pfVar1 + 0x36);
    fStack_4bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x36) >> 0x20);
    local_658 = (float)*(undefined8 *)(pfStack_888 + 8);
    local_4e8 = (float)*(undefined8 *)(pfVar1 + 0x38);
    fStack_4e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x38) >> 0x20);
    fStack_4e0 = (float)*(undefined8 *)(pfVar1 + 0x3a);
    fStack_4dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x3a) >> 0x20);
    local_508 = (float)*(undefined8 *)(pfVar1 + 0x3b);
    fStack_504 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x3b) >> 0x20);
    fStack_500 = (float)*(undefined8 *)(pfVar1 + 0x3d);
    fStack_4fc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x3d) >> 0x20);
    fStack_664 = (float)((ulong)*(undefined8 *)(pfStack_888 + 8) >> 0x20);
    local_528 = (float)*(undefined8 *)(pfVar1 + 0x3f);
    fStack_524 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x3f) >> 0x20);
    fStack_520 = (float)*(undefined8 *)(pfVar1 + 0x41);
    fStack_51c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x41) >> 0x20);
    local_548 = (float)*(undefined8 *)(pfVar1 + 0x42);
    fStack_544 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x42) >> 0x20);
    fStack_540 = (float)*(undefined8 *)(pfVar1 + 0x44);
    fStack_53c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x44) >> 0x20);
    fStack_670 = (float)*(undefined8 *)(pfStack_888 + 10);
    local_568 = (float)*(undefined8 *)(pfVar1 + 0x46);
    fStack_564 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x46) >> 0x20);
    fStack_560 = (float)*(undefined8 *)(pfVar1 + 0x48);
    fStack_55c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x48) >> 0x20);
    local_588 = (float)*(undefined8 *)(pfVar1 + 0x49);
    fStack_584 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x49) >> 0x20);
    fStack_580 = (float)*(undefined8 *)(pfVar1 + 0x4b);
    fStack_57c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x4b) >> 0x20);
    fStack_67c = (float)((ulong)*(undefined8 *)(pfStack_888 + 10) >> 0x20);
    local_5a8 = (float)*(undefined8 *)(pfVar1 + 0x4d);
    fStack_5a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x4d) >> 0x20);
    fStack_5a0 = (float)*(undefined8 *)(pfVar1 + 0x4f);
    fStack_59c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x4f) >> 0x20);
    local_5c8 = (float)*(undefined8 *)(pfVar1 + 0x50);
    fStack_5c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x50) >> 0x20);
    fStack_5c0 = (float)*(undefined8 *)(pfVar1 + 0x52);
    fStack_5bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x52) >> 0x20);
    *(ulong *)(decode + 3) =
         CONCAT44(local_5d8 * fStack_304 + fStack_5f0 * fStack_384 + local_618 * fStack_404 +
                  fStack_630 * fStack_484 + local_658 * fStack_504 + fStack_670 * fStack_584 +
                  fStack_5e4 * fStack_344 + fStack_5fc * fStack_3c4 + fStack_624 * fStack_444 +
                  fStack_63c * fStack_4c4 + fStack_664 * fStack_544 + fStack_67c * fStack_5c4,
                  local_5d8 * local_308 + fStack_5f0 * local_388 + local_618 * local_408 +
                  fStack_630 * local_488 + local_658 * local_508 + fStack_670 * local_588 +
                  fStack_5e4 * local_348 + fStack_5fc * local_3c8 + fStack_624 * local_448 +
                  fStack_63c * local_4c8 + fStack_664 * local_548 + fStack_67c * local_5c8);
    *(ulong *)(decode + 5) =
         CONCAT44(local_5d8 * fStack_2fc + fStack_5f0 * fStack_37c + local_618 * fStack_3fc +
                  fStack_630 * fStack_47c + local_658 * fStack_4fc + fStack_670 * fStack_57c +
                  fStack_5e4 * fStack_33c + fStack_5fc * fStack_3bc + fStack_624 * fStack_43c +
                  fStack_63c * fStack_4bc + fStack_664 * fStack_53c + fStack_67c * fStack_5bc,
                  local_5d8 * fStack_300 + fStack_5f0 * fStack_380 + local_618 * fStack_400 +
                  fStack_630 * fStack_480 + local_658 * fStack_500 + fStack_670 * fStack_580 +
                  fStack_5e4 * fStack_340 + fStack_5fc * fStack_3c0 + fStack_624 * fStack_440 +
                  fStack_63c * fStack_4c0 + fStack_664 * fStack_540 + fStack_67c * fStack_5c0);
    *(ulong *)decode =
         CONCAT44(local_5d8 * fStack_2e4 + fStack_5f0 * fStack_364 + local_618 * fStack_3e4 +
                  fStack_630 * fStack_464 + local_658 * fStack_4e4 + fStack_670 * fStack_564 +
                  fStack_5e4 * fStack_324 + fStack_5fc * fStack_3a4 + fStack_624 * fStack_424 +
                  fStack_63c * fStack_4a4 + fStack_664 * fStack_524 + fStack_67c * fStack_5a4,
                  local_5d8 * local_2e8 + fStack_5f0 * local_368 + local_618 * local_3e8 +
                  fStack_630 * local_468 + local_658 * local_4e8 + fStack_670 * local_568 +
                  fStack_5e4 * local_328 + fStack_5fc * local_3a8 + fStack_624 * local_428 +
                  fStack_63c * local_4a8 + fStack_664 * local_528 + fStack_67c * local_5a8);
    *(ulong *)(decode + 2) =
         CONCAT44(local_5d8 * fStack_2dc + fStack_5f0 * fStack_35c + local_618 * fStack_3dc +
                  fStack_630 * fStack_45c + local_658 * fStack_4dc + fStack_670 * fStack_55c +
                  fStack_5e4 * fStack_31c + fStack_5fc * fStack_39c + fStack_624 * fStack_41c +
                  fStack_63c * fStack_49c + fStack_664 * fStack_51c + fStack_67c * fStack_59c,
                  local_5d8 * fStack_2e0 + fStack_5f0 * fStack_360 + local_618 * fStack_3e0 +
                  fStack_630 * fStack_460 + local_658 * fStack_4e0 + fStack_670 * fStack_560 +
                  fStack_5e4 * fStack_320 + fStack_5fc * fStack_3a0 + fStack_624 * fStack_420 +
                  fStack_63c * fStack_4a0 + fStack_664 * fStack_520 + fStack_67c * fStack_5a0);
    pfStack_888 = pfStack_888 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 7;
  } while (decode < output_buffer + output_sub_size * 7);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_12_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__4_coeff_continue_from_4(8);
    stbir__store_output();
  } while ( output < output_end );
}